

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O1

void __thiscall icu_63::ReorderingBuffer::insert(ReorderingBuffer *this,UChar32 c,uint8_t cc)

{
  UChar *pUVar1;
  byte bVar2;
  ulong uVar3;
  UChar *pUVar4;
  UChar *pUVar5;
  
  pUVar5 = this->limit;
  this->codePointLimit = pUVar5;
  this->codePointStart = pUVar5 + -1;
  if ((((pUVar5[-1] & 0xfc00U) == 0xdc00) && (this->start < pUVar5 + -1)) &&
     ((pUVar5[-2] & 0xfc00U) == 0xd800)) {
    this->codePointStart = pUVar5 + -2;
  }
  do {
    bVar2 = previousCC(this);
  } while (cc < bVar2);
  pUVar5 = this->limit;
  uVar3 = -(ulong)((uint)c < 0x10000) + 2;
  pUVar1 = this->codePointLimit;
  this->limit = pUVar5 + (uVar3 & 0xffffffff);
  do {
    pUVar4 = pUVar5;
    pUVar4[-(ulong)((uint)c < 0x10000) + 1] = pUVar4[-1];
    pUVar5 = pUVar4 + -1;
  } while (pUVar5 != pUVar1);
  if (c < 0x10000) {
    *pUVar5 = (UChar)c;
  }
  else {
    *pUVar5 = (short)((uint)c >> 10) + L'ퟀ';
    *pUVar4 = (UChar)c & 0x3ffU | 0xdc00;
  }
  if (cc < 2) {
    this->reorderStart = pUVar5 + uVar3;
  }
  return;
}

Assistant:

void ReorderingBuffer::insert(UChar32 c, uint8_t cc) {
    for(setIterator(), skipPrevious(); previousCC()>cc;) {}
    // insert c at codePointLimit, after the character with prevCC<=cc
    UChar *q=limit;
    UChar *r=limit+=U16_LENGTH(c);
    do {
        *--r=*--q;
    } while(codePointLimit!=q);
    writeCodePoint(q, c);
    if(cc<=1) {
        reorderStart=r;
    }
}